

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O3

void load_patch(_mdi *mdi,unsigned_short patchid)

{
  _sample **pp_Var1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  unsigned_short uVar6;
  unsigned_long uVar7;
  float fVar8;
  ushort uVar9;
  short sVar10;
  _patch *p_Var11;
  _sample *p_Var12;
  _sample *p_Var13;
  _patch **pp_Var14;
  ushort uVar15;
  uint uVar16;
  ushort uVar17;
  long lVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  ushort uVar22;
  uchar *puVar23;
  ulong uVar24;
  bool bVar25;
  
  if (mdi->patch_count != 0) {
    uVar16 = 1;
    uVar24 = 0;
    do {
      if (mdi->patches[uVar24]->patchid == patchid) {
        return;
      }
      uVar24 = (ulong)uVar16;
      uVar16 = uVar16 + 1;
    } while (uVar24 < mdi->patch_count);
  }
  p_Var11 = get_patch_data(patchid);
  if (p_Var11 == (_patch *)0x0) {
    return;
  }
  FCriticalSection::Enter(&patch_lock);
  if (p_Var11->loaded == '\0') {
    p_Var11->loaded = '\x01';
    p_Var12 = _WM_load_gus_pat(p_Var11->filename,(uint)fix_release);
    if (p_Var12 == (_sample *)0x0) goto LAB_0034588d;
    if (auto_amp == '\x01') {
      uVar9 = 0;
      uVar15 = 0;
      p_Var13 = p_Var12;
      do {
        if (p_Var13->data_length < 0x400) {
          uVar22 = 0;
          uVar17 = 0;
        }
        else {
          uVar24 = 0;
          uVar17 = 0;
          uVar22 = 0;
          do {
            uVar5 = p_Var13->data[uVar24];
            if ((short)uVar22 < (short)uVar5) {
              uVar22 = uVar5;
            }
            if ((short)uVar17 <= (short)uVar5) {
              uVar5 = uVar17;
            }
            uVar17 = uVar5;
            uVar24 = uVar24 + 1;
          } while (p_Var13->data_length >> 10 != uVar24);
        }
        if ((short)uVar9 < (short)uVar22) {
          uVar9 = uVar22;
        }
        if ((short)uVar17 < (short)uVar15) {
          uVar15 = uVar17;
        }
        p_Var13 = p_Var13->next;
      } while (p_Var13 != (_sample *)0x0);
      iVar20 = (int)(short)uVar15;
      uVar21 = -iVar20;
      uVar16 = (uint)uVar9;
      if (auto_amp_with_amp == '\x01') {
        if (SBORROW4(uVar16,uVar21) == (int)(uVar16 + iVar20) < 0) {
          iVar20 = (int)(0x1fffc00 / (ulong)uVar9);
        }
        else {
          iVar20 = (int)(0x2000000 / (ulong)uVar21);
        }
        sVar10 = (short)((uint)(iVar20 * p_Var11->amp) >> 10);
      }
      else if (SBORROW4(uVar16,uVar21) == (int)(uVar16 + iVar20) < 0) {
        sVar10 = (short)(0x1fffc00 / (ulong)uVar9);
      }
      else {
        sVar10 = (short)(0x2000000 / (ulong)uVar21);
      }
      p_Var11->amp = sVar10;
    }
    p_Var11->first_sample = p_Var12;
    uVar6 = p_Var11->patchid;
    if ((char)uVar6 < '\0') {
      bVar2 = p_Var11->keep;
      p_Var13 = p_Var12;
      if ((bVar2 & 4) == 0) {
        do {
          p_Var13->modes = p_Var13->modes & 0xfb;
          pp_Var1 = &p_Var13->next;
          p_Var13 = *pp_Var1;
        } while (*pp_Var1 != (_sample *)0x0);
      }
      p_Var13 = p_Var12;
      if ((bVar2 & 0x40) == 0) {
        do {
          p_Var13->modes = p_Var13->modes & 0xbf;
          pp_Var1 = &p_Var13->next;
          p_Var13 = *pp_Var1;
        } while (*pp_Var1 != (_sample *)0x0);
      }
    }
    p_Var13 = p_Var12;
    if (uVar6 == 0x2f) {
      do {
        if ((p_Var13->modes & 4) == 0) {
          iVar20 = p_Var13->env_rate[2];
          lVar18 = 0;
          do {
            p_Var13->env_target[lVar18 + 3] = p_Var13->env_target[2];
            p_Var13->env_rate[lVar18 + 3] = iVar20;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
        }
        pp_Var1 = &p_Var13->next;
        p_Var13 = *pp_Var1;
      } while (*pp_Var1 != (_sample *)0x0);
    }
    uVar21 = (uint)_WM_SampleRate;
    bVar2 = p_Var11->keep;
    uVar16 = (uint)_WM_SampleRate;
    bVar3 = p_Var11->remove;
    do {
      if (((bVar3 & 0x20) != 0) && ((p_Var12->modes & 0x20) != 0)) {
        p_Var12->modes = p_Var12->modes & 0xdf;
      }
      bVar19 = p_Var12->modes;
      if (((char)bVar3 < '\0') && ((char)bVar19 < '\0')) {
        bVar19 = bVar19 & 0x7f;
        p_Var12->modes = bVar19;
      }
      bVar25 = (bVar2 & 0x40) != 0;
      if (bVar25) {
        p_Var12->modes = bVar19 | 0x40;
      }
      lVar18 = 0;
      puVar23 = &p_Var11->env[0].set;
      do {
        if (bVar25 || (bVar19 & 0x40) != 0) {
          bVar4 = *puVar23;
          if ((bVar4 & 2) != 0) {
            p_Var12->env_target[lVar18] = (int)(long)(*(float *)(puVar23 + -4) * 255.0) * 0x4040;
          }
          if ((bVar4 & 1) != 0) {
            fVar8 = ((_env *)(puVar23 + -8))->time * (float)uVar21 * 0.001;
            goto LAB_00345824;
          }
        }
        else {
          p_Var12->env_target[lVar18] = 0x3fffff;
          fVar8 = (float)uVar16 * 0.001456;
LAB_00345824:
          p_Var12->env_rate[lVar18] = (int)(long)(4194303.0 / fVar8);
        }
        lVar18 = lVar18 + 1;
        puVar23 = puVar23 + 0xc;
      } while (lVar18 != 6);
      p_Var12 = p_Var12->next;
    } while (p_Var12 != (_sample *)0x0);
  }
  else if (p_Var11->first_sample == (_sample *)0x0) goto LAB_0034588d;
  uVar7 = mdi->patch_count;
  mdi->patch_count = uVar7 + 1;
  pp_Var14 = (_patch **)realloc(mdi->patches,uVar7 * 8 + 8);
  mdi->patches = pp_Var14;
  pp_Var14[mdi->patch_count - 1] = p_Var11;
  p_Var11->inuse_count = p_Var11->inuse_count + 1;
LAB_0034588d:
  FCriticalSection::Leave(&patch_lock);
  return;
}

Assistant:

static void load_patch(struct _mdi *mdi, unsigned short patchid) {
	unsigned int i;
	struct _patch *tmp_patch = NULL;

	for (i = 0; i < mdi->patch_count; i++) {
		if (mdi->patches[i]->patchid == patchid) {
			return;
		}
	}

	tmp_patch = get_patch_data(patchid);
	if (tmp_patch == NULL) {
		return;
	}

	patch_lock.Enter();
	if (!tmp_patch->loaded) {
		if (load_sample(tmp_patch) == -1) {
			patch_lock.Leave();
			return;
		}
	}

	if (tmp_patch->first_sample == NULL) {
		patch_lock.Leave();
		return;
	}

	mdi->patch_count++;
	mdi->patches = (struct _patch**)realloc(mdi->patches,
			(sizeof(struct _patch*) * mdi->patch_count));
	mdi->patches[mdi->patch_count - 1] = tmp_patch;
	tmp_patch->inuse_count++;
	patch_lock.Leave();
}